

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::InStateSequence(AActor *this,FState *newstate,FState *basestate)

{
  FState *pFVar1;
  FState *pFVar2;
  FState *local_30;
  FState *thisstate;
  FState *basestate_local;
  FState *newstate_local;
  AActor *this_local;
  
  local_30 = basestate;
  if (basestate != (FState *)0x0) {
    do {
      if (newstate == local_30) {
        return true;
      }
      pFVar1 = FState::GetNextState(local_30);
      pFVar2 = local_30 + 1;
      local_30 = pFVar1;
    } while (pFVar1 == pFVar2);
  }
  return false;
}

Assistant:

bool AActor::InStateSequence(FState * newstate, FState * basestate)
{
	if (basestate == NULL) return false;

	FState * thisstate = basestate;
	do
	{
		if (newstate == thisstate) return true;
		basestate = thisstate;
		thisstate = thisstate->GetNextState();
	}
	while (thisstate == basestate+1);
	return false;
}